

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc:1309:23)>_>
::Visit<google::protobuf::DescriptorProto>
          (VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_command_line_interface_cc:1309:23)>_>
           *this,Descriptor *descriptor,DescriptorProto *proto)

{
  string *psVar1;
  EnumDescriptor *pEVar2;
  Descriptor *pDVar3;
  anon_union_224_1_493b367e_for_DescriptorProto_3 *paVar4;
  bool bVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_01;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>_>
  *pVVar8;
  FieldDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  long lVar9;
  int iVar10;
  undefined1 *puVar11;
  long lVar12;
  string_view file_name;
  string_view file_name_00;
  string_view file_name_01;
  DescriptorProto *pDVar13;
  DescriptorProto *pDVar14;
  
  puVar11 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((MessageOptions *)puVar11 == (MessageOptions *)0x0) {
    puVar11 = _MessageOptions_default_instance_;
  }
  psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
  file_name._M_str = (char *)0x3;
  file_name._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
  bVar5 = compiler::anon_unknown_5::ValidateTargetConstraints
                    ((anon_unknown_5 *)puVar11,
                     (Message *)
                     (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                     super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                     ,(DescriptorPool *)
                      &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t).
                        super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                        .
                        super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                       ._M_head_impl)->super_ErrorCollector,
                     (ErrorCollector *)psVar1->_M_string_length,file_name,(OptionTargetType)proto);
  if (!bVar5) {
    *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
  }
  if (0 < descriptor->enum_type_count_) {
    paVar4 = &proto->field_0;
    lVar9 = 0;
    lVar12 = 0;
    do {
      pEVar2 = descriptor->enum_types_;
      proto_00 = RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                           (&(paVar4->_impl_).enum_type_.super_RepeatedPtrFieldBase,(int)lVar12);
      Visit<google::protobuf::EnumDescriptorProto>
                (this,(EnumDescriptor *)(&pEVar2->super_SymbolBase + lVar9),proto_00);
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x58;
    } while (lVar12 < descriptor->enum_type_count_);
  }
  pDVar13 = proto;
  if (0 < descriptor->oneof_decl_count_) {
    iVar10 = 0;
    do {
      pVVar6 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                         (&(proto->field_0)._impl_.oneof_decl_.super_RepeatedPtrFieldBase,iVar10);
      puVar11 = (undefined1 *)(pVVar6->field_0)._impl_.options_;
      if ((OneofOptions *)puVar11 == (OneofOptions *)0x0) {
        puVar11 = _OneofOptions_default_instance_;
      }
      psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
      file_name_00._M_str = &DAT_00000005;
      file_name_00._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
      bVar5 = compiler::anon_unknown_5::ValidateTargetConstraints
                        ((anon_unknown_5 *)puVar11,
                         (Message *)
                         (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ,(DescriptorPool *)
                          &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t)
                            .
                            super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                           ._M_head_impl)->super_ErrorCollector,
                         (ErrorCollector *)psVar1->_M_string_length,file_name_00,
                         (OptionTargetType)pDVar13);
      if (!bVar5) {
        *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < descriptor->oneof_decl_count_);
  }
  if (0 < descriptor->field_count_) {
    iVar10 = 0;
    do {
      pVVar7 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(proto->field_0)._impl_.field_.super_RepeatedPtrFieldBase,iVar10);
      Visit<google::protobuf::FieldDescriptorProto>
                (this,(FieldDescriptor *)(pVVar7->field_0)._impl_.options_,proto_02);
      iVar10 = iVar10 + 1;
    } while (iVar10 < descriptor->field_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    paVar4 = &pDVar13->field_0;
    lVar9 = 0;
    lVar12 = 0;
    do {
      pDVar3 = descriptor->nested_types_;
      proto_01 = RepeatedPtrFieldBase::
                 Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(paVar4->_impl_).nested_type_.super_RepeatedPtrFieldBase,(int)lVar12);
      Visit<google::protobuf::DescriptorProto>
                (this,(Descriptor *)(&pDVar3->super_SymbolBase + lVar9),proto_01);
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0xa0;
    } while (lVar12 < descriptor->nested_type_count_);
  }
  pDVar14 = pDVar13;
  if (0 < descriptor->extension_count_) {
    iVar10 = 0;
    do {
      pVVar7 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                         (&(pDVar13->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,iVar10);
      Visit<google::protobuf::FieldDescriptorProto>
                (this,(FieldDescriptor *)(pVVar7->field_0)._impl_.options_,proto_03);
      iVar10 = iVar10 + 1;
    } while (iVar10 < descriptor->extension_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    iVar10 = 0;
    do {
      pVVar8 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>>
                         (&(pDVar13->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase,
                          iVar10);
      puVar11 = (undefined1 *)(pVVar8->field_0)._impl_.options_;
      if ((ExtensionRangeOptions *)puVar11 == (ExtensionRangeOptions *)0x0) {
        puVar11 = _ExtensionRangeOptions_default_instance_;
      }
      psVar1 = (*(this->visitor).super_anon_class_32_4_e643f291.file)->name_;
      file_name_01._M_str = (char *)0x2;
      file_name_01._M_len = (size_t)(psVar1->_M_dataplus)._M_p;
      bVar5 = compiler::anon_unknown_5::ValidateTargetConstraints
                        ((anon_unknown_5 *)puVar11,
                         (Message *)
                         (((this->visitor).super_anon_class_32_4_e643f291.descriptor_pool)->_M_t).
                         super___uniq_ptr_impl<google::protobuf::DescriptorPool,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::DescriptorPool_*,_std::default_delete<google::protobuf::DescriptorPool>_>
                         ,(DescriptorPool *)
                          &((((this->visitor).super_anon_class_32_4_e643f291.error_collector)->_M_t)
                            .
                            super___uniq_ptr_impl<google::protobuf::compiler::CommandLineInterface::ErrorPrinter,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_std::default_delete<google::protobuf::compiler::CommandLineInterface::ErrorPrinter>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::CommandLineInterface::ErrorPrinter_*,_false>
                           ._M_head_impl)->super_ErrorCollector,
                         (ErrorCollector *)psVar1->_M_string_length,file_name_01,
                         (OptionTargetType)pDVar14);
      if (!bVar5) {
        *(this->visitor).super_anon_class_32_4_e643f291.validation_error = true;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < descriptor->extension_range_count_);
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }